

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

void __thiscall
ezc3d::DataNS::Points3dNS::Point::Point(Point *this,c3d *c3d,fstream *file,Info *info)

{
  PROCESSOR_TYPE PVar1;
  int iVar2;
  runtime_error *prVar3;
  Info *in_RCX;
  c3d *in_RSI;
  long *in_RDI;
  float fVar4;
  double dVar5;
  double dVar6;
  Vector3d *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  fstream *in_stack_fffffffffffffe20;
  PROCESSOR_TYPE in_stack_fffffffffffffe2c;
  c3d *in_stack_fffffffffffffe30;
  PROCESSOR_TYPE in_stack_fffffffffffffe3c;
  c3d *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe90;
  undefined1 __x;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffea0;
  
  __x = (undefined1)((ulong)in_stack_fffffffffffffe90 >> 0x38);
  Vector3d::Vector3d(in_stack_fffffffffffffe00);
  *in_RDI = (long)&PTR_print_001a6a20;
  in_RDI[6] = -0x4010000000000000;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x176b31);
  std::vector<bool,_std::allocator<bool>_>::resize
            (in_stack_fffffffffffffea0,CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
             ,(bool)__x);
  dVar5 = Info::scaleFactor(in_RCX);
  if (0.0 <= dVar5) {
    Info::processorType(in_RCX);
    iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                in_stack_fffffffffffffe20,
                                (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                (int)in_stack_fffffffffffffe18,
                                (seekdir *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    dVar5 = Info::scaleFactor(in_RCX);
    (**(code **)(*in_RDI + 0xd8))((double)iVar2 * dVar5);
    Info::processorType(in_RCX);
    iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                in_stack_fffffffffffffe20,
                                (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                (int)in_stack_fffffffffffffe18,
                                (seekdir *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    dVar5 = Info::scaleFactor(in_RCX);
    (**(code **)(*in_RDI + 0xe8))((double)iVar2 * dVar5);
    Info::processorType(in_RCX);
    iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                in_stack_fffffffffffffe20,
                                (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                (int)in_stack_fffffffffffffe18,
                                (seekdir *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    dVar5 = Info::scaleFactor(in_RCX);
    (**(code **)(*in_RDI + 0xf8))((double)iVar2 * dVar5);
    PVar1 = Info::processorType(in_RCX);
    if (PVar1 == INTEL) {
      Info::processorType(in_RCX);
      iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                  in_stack_fffffffffffffe20,
                                  (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                  (int)in_stack_fffffffffffffe18,
                                  (seekdir *)
                                  CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      (**(code **)(*in_RDI + 0x160))(in_RDI,iVar2);
      Info::processorType(in_RCX);
      iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                  in_stack_fffffffffffffe20,
                                  (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                  (int)in_stack_fffffffffffffe18,
                                  (seekdir *)
                                  CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      dVar5 = Info::scaleFactor(in_RCX);
      (**(code **)(*in_RDI + 0x148))((double)iVar2 * dVar5);
    }
    else {
      PVar1 = Info::processorType(in_RCX);
      if (PVar1 == DEC) {
        Info::processorType(in_RCX);
        iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                    in_stack_fffffffffffffe20,
                                    (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                    (int)in_stack_fffffffffffffe18,
                                    (seekdir *)
                                    CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        (**(code **)(*in_RDI + 0x160))(in_RDI,iVar2);
        Info::processorType(in_RCX);
        iVar2 = ezc3d::c3d::readInt(in_RSI,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20,
                                    (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                    (int)in_stack_fffffffffffffe18,
                                    (seekdir *)
                                    CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        dVar5 = (double)iVar2;
        dVar6 = Info::scaleFactor(in_RCX);
        (**(code **)(*in_RDI + 0x148))(dVar5 * dVar6);
      }
      else {
        PVar1 = Info::processorType(in_RCX);
        if (PVar1 == MIPS) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar3,
                     "MIPS processor type not supported yet, please open a GitHub issue to report that you want this feature!"
                    );
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
  }
  else {
    Info::processorType(in_RCX);
    fVar4 = ezc3d::c3d::readFloat
                      (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                       (fstream *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                       (seekdir *)in_stack_fffffffffffffe20);
    (**(code **)(*in_RDI + 0xd8))((double)fVar4);
    Info::processorType(in_RCX);
    fVar4 = ezc3d::c3d::readFloat
                      (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                       (fstream *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                       (seekdir *)in_stack_fffffffffffffe20);
    (**(code **)(*in_RDI + 0xe8))((double)fVar4);
    Info::processorType(in_RCX);
    fVar4 = ezc3d::c3d::readFloat
                      (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                       (fstream *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                       (seekdir *)in_stack_fffffffffffffe20);
    (**(code **)(*in_RDI + 0xf8))((double)fVar4);
    PVar1 = Info::processorType(in_RCX);
    if (PVar1 == INTEL) {
      Info::processorType(in_RCX);
      iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                  in_stack_fffffffffffffe20,
                                  (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                  (int)in_stack_fffffffffffffe18,
                                  (seekdir *)
                                  CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      (**(code **)(*in_RDI + 0x160))(in_RDI,iVar2);
      Info::processorType(in_RCX);
      iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                  in_stack_fffffffffffffe20,
                                  (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                  (int)in_stack_fffffffffffffe18,
                                  (seekdir *)
                                  CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      dVar5 = Info::scaleFactor(in_RCX);
      (**(code **)(*in_RDI + 0x148))((double)iVar2 * -dVar5);
    }
    else {
      PVar1 = Info::processorType(in_RCX);
      if (PVar1 == DEC) {
        Info::processorType(in_RCX);
        iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                    in_stack_fffffffffffffe20,
                                    (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                    (int)in_stack_fffffffffffffe18,
                                    (seekdir *)
                                    CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        dVar5 = Info::scaleFactor(in_RCX);
        (**(code **)(*in_RDI + 0x148))((double)iVar2 * -dVar5);
        Info::processorType(in_RCX);
        iVar2 = ezc3d::c3d::readInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                                    in_stack_fffffffffffffe20,
                                    (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                    (int)in_stack_fffffffffffffe18,
                                    (seekdir *)
                                    CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        (**(code **)(*in_RDI + 0x160))(in_RDI,iVar2);
      }
      else {
        PVar1 = Info::processorType(in_RCX);
        if (PVar1 == MIPS) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar3,
                     "MIPS processor type not supported yet, please open a GitHub issue to report that you want this feature!"
                    );
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
  }
  dVar5 = (double)(**(code **)(*in_RDI + 0x140))();
  if (dVar5 < 0.0) {
    (**(code **)(*in_RDI + 200))(0x7ff8000000000000);
  }
  return;
}

Assistant:

ezc3d::DataNS::Points3dNS::Point::Point(
    ezc3d::c3d &c3d, std::fstream &file,
    const ezc3d::DataNS::Points3dNS::Info &info)
    : ezc3d::Vector3d(), _residual(-1) {
  _cameraMasks.resize(7, false);
  if (info.scaleFactor() < 0) { // if it is float
    x(c3d.readFloat(info.processorType(), file));
    y(c3d.readFloat(info.processorType(), file));
    z(c3d.readFloat(info.processorType(), file));
    if (info.processorType() == PROCESSOR_TYPE::INTEL) {
      cameraMask(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD));
      residual(static_cast<float>(c3d.readInt(info.processorType(), file,
                                              ezc3d::DATA_TYPE::WORD)) *
               -info.scaleFactor());
    } else if (info.processorType() == PROCESSOR_TYPE::DEC) {
      residual(static_cast<float>(c3d.readInt(info.processorType(), file,
                                              ezc3d::DATA_TYPE::WORD)) *
               -info.scaleFactor());
      cameraMask(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD));
    } else if (info.processorType() == PROCESSOR_TYPE::MIPS) {
      throw std::runtime_error(
          "MIPS processor type not supported yet, please open a "
          "GitHub issue to report that you want this feature!");
    }
  } else {
    x(static_cast<float>(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD)) *
      info.scaleFactor());
    y(static_cast<float>(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD)) *
      info.scaleFactor());
    z(static_cast<float>(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::WORD)) *
      info.scaleFactor());
    if (info.processorType() == PROCESSOR_TYPE::INTEL) {
      cameraMask(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::BYTE));
      residual(static_cast<float>(c3d.readInt(info.processorType(), file,
                                              ezc3d::DATA_TYPE::BYTE)) *
               info.scaleFactor());
    } else if (info.processorType() == PROCESSOR_TYPE::DEC) {
      cameraMask(
          c3d.readInt(info.processorType(), file, ezc3d::DATA_TYPE::BYTE));
      residual(static_cast<float>(c3d.readInt(info.processorType(), file,
                                              ezc3d::DATA_TYPE::BYTE)) *
               info.scaleFactor());
    } else if (info.processorType() == PROCESSOR_TYPE::MIPS) {
      throw std::runtime_error(
          "MIPS processor type not supported yet, please open a "
          "GitHub issue to report that you want this feature!");
    }
  }
  if (residual() < 0) {
    set(NAN, NAN, NAN);
  }
}